

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O2

void __thiscall vec<WellFounded>::growTo(vec<WellFounded> *this,uint size)

{
  long lVar1;
  ulong uVar2;
  
  if (this->sz < size) {
    reserve(this,size);
    uVar2 = (ulong)this->sz;
    lVar1 = uVar2 * 0x230;
    for (; uVar2 < size; uVar2 = uVar2 + 1) {
      WellFounded::WellFounded
                ((WellFounded *)((long)&(this->data->super_Propagator)._vptr_Propagator + lVar1));
      lVar1 = lVar1 + 0x230;
    }
    this->sz = size;
  }
  return;
}

Assistant:

void growTo(unsigned int size) {
		if (size <= sz) {
			return;
		}
		reserve(size);
		for (unsigned int i = sz; i < size; i++) {
			new (&data[i]) T();
		}
		sz = size;
	}